

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall sznet::net::Connector::retry(Connector *this,sz_sock sockfd)

{
  char *pcVar1;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  LogStream *pLVar4;
  char **ppcVar5;
  int iVar6;
  uint uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1048 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_1040 [501];
  char *local_98 [4];
  string local_78;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  EventLoop *local_38;
  
  sockets::sz_closesocket(sockfd);
  this->m_state = kDisconnected;
  if (this->m_connect == true) {
    if (g_logLevel < 3) {
      file._8_8_ = 0xd;
      file.m_data = "Connector.cpp";
      Logger::Logger((Logger *)local_1048,file,0xdc);
      iVar6 = (int)local_98;
      if (0x27 < (uint)(iVar6 - (int)local_98[0])) {
        builtin_strncpy(local_98[0],"Connector::retry - Retry connecting to ",0x27);
        local_98[0] = local_98[0] + 0x27;
      }
      InetAddress::toIpPort_abi_cxx11_(&local_78,&this->m_serverAddr);
      uVar7 = iVar6 - (int)local_98[0];
      if (local_78._M_string_length < (ulong)(long)(int)uVar7) {
        memcpy(local_98[0],local_78._M_dataplus._M_p,local_78._M_string_length);
        local_98[0] = local_98[0] + local_78._M_string_length;
        uVar7 = iVar6 - (int)local_98[0];
      }
      if (4 < uVar7) {
        builtin_strncpy(local_98[0]," in ",4);
        local_98[0] = local_98[0] + 4;
      }
      pLVar4 = LogStream::operator<<((LogStream *)ap_Stack_1040,this->m_retryDelayMs);
      pcVar1 = (pLVar4->m_buffer).m_cur;
      ppcVar5 = &(pLVar4->m_buffer).m_cur;
      if (((int)ppcVar5 - (int)pcVar1 & 0xfffffff0U) != 0) {
        builtin_strncpy(pcVar1," milliseconds. ",0xf);
        *ppcVar5 = *ppcVar5 + 0xf;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      Logger::~Logger((Logger *)local_1048);
    }
    local_38 = this->m_loop;
    iVar6 = this->m_retryDelayMs;
    std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::Connector,void>
              ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)local_1048,
               (__weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2> *)this);
    p_Var3 = ap_Stack_1040[0];
    auVar2 = local_1048;
    local_1048 = (undefined1  [8])0x0;
    ap_Stack_1040[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    pcStack_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = operator_new(0x20);
    *(code **)local_58._M_unused._0_8_ = startInLoop;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
    *(undefined1 (*) [8])((long)local_58._M_unused._0_8_ + 0x10) = auVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x18) =
         p_Var3;
    pcStack_40 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(std::shared_ptr<sznet::net::Connector>))()>_>
                 ::_M_invoke;
    pcStack_48 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(std::shared_ptr<sznet::net::Connector>))()>_>
                 ::_M_manager;
    EventLoop::runAfter(local_38,(double)iVar6 / 1000.0,(TimerCallback *)&local_58);
    if (pcStack_48 != (code *)0x0) {
      (*pcStack_48)(&local_58,&local_58,__destroy_functor);
    }
    if (ap_Stack_1040[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_1040[0]);
    }
    iVar6 = this->m_retryDelayMs * 2;
    if (29999 < iVar6) {
      iVar6 = 30000;
    }
    this->m_retryDelayMs = iVar6;
  }
  else if (g_logLevel < 2) {
    file_00._8_8_ = 0xd;
    file_00.m_data = "Connector.cpp";
    Logger::Logger((Logger *)local_1048,file_00,0xe4,DEBUG,"retry");
    if (0xe < (uint)((int)local_98 - (int)local_98[0])) {
      builtin_strncpy(local_98[0],"do not connect",0xe);
      local_98[0] = local_98[0] + 0xe;
    }
    Logger::~Logger((Logger *)local_1048);
  }
  return;
}

Assistant:

void Connector::retry(sockets::sz_sock sockfd)
{
	sockets::sz_closesocket(sockfd);
	setState(kDisconnected);
	if (m_connect)
	{
		LOG_INFO << "Connector::retry - Retry connecting to " << m_serverAddr.toIpPort()
			<< " in " << m_retryDelayMs << " milliseconds. ";
		m_loop->runAfter(m_retryDelayMs / 1000.0, std::bind(&Connector::startInLoop, shared_from_this()));
		// �����ӳټӱ����������������ӳ�
		m_retryDelayMs = std::min(m_retryDelayMs * 2, kMaxRetryDelayMs);
	}
	else
	{
		LOG_DEBUG << "do not connect";
	}
}